

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

int Abs_GiaSortNodes(Gia_Man_t *p,Vec_Int_t *vSupp)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = vSupp->nSize;
  uVar8 = (ulong)(int)uVar1;
  uVar9 = uVar1;
  if (0 < (long)uVar8) {
    uVar5 = 0;
    uVar10 = (ulong)uVar1;
    do {
      uVar9 = (uint)uVar10;
      iVar2 = vSupp->pArray[uVar5];
      lVar6 = (long)iVar2;
      if ((lVar6 < 0) || (p->nObjs <= iVar2)) goto LAB_00576c9b;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar5 < uVar8) {
        if (p->nObjs <= iVar2) goto LAB_00576cba;
        if ((p->pRefs[lVar6] == 0) &&
           ((uVar10 = *(ulong *)(p->pObjs + lVar6), ((uint)uVar10 & 0x9fffffff) != 0x9fffffff ||
            ((int)((uint)(uVar10 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)))) {
          if ((uVar10 >> 0x3e & 1) == 0) {
            __assert_fail("pObj->fMark1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                          ,0x1b1,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
          }
          Vec_IntPush(vSupp,iVar2);
        }
      }
      uVar5 = uVar5 + 1;
      uVar9 = vSupp->nSize;
      uVar10 = (ulong)(int)uVar9;
    } while ((long)uVar5 < (long)uVar10);
  }
  uVar4 = vSupp->nSize;
  uVar5 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    lVar6 = 0;
    do {
      uVar4 = (uint)uVar5;
      iVar2 = vSupp->pArray[lVar6];
      lVar7 = (long)iVar2;
      if ((lVar7 < 0) || (p->nObjs <= iVar2)) {
LAB_00576c9b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (lVar6 < (long)uVar8) {
        if (p->nObjs <= iVar2) {
LAB_00576cba:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if ((p->pRefs[lVar7] != 0) ||
           ((uVar3 = *(undefined8 *)(p->pObjs + lVar7), ((uint)uVar3 & 0x9fffffff) == 0x9fffffff &&
            (p->vCis->nSize - p->nRegs <= (int)((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))))) {
          Vec_IntPush(vSupp,iVar2);
        }
      }
      lVar6 = lVar6 + 1;
      uVar4 = vSupp->nSize;
      uVar5 = (ulong)(int)uVar4;
    } while (lVar6 < (long)uVar5);
  }
  if (uVar4 != uVar1 * 2) {
    __assert_fail("Vec_IntSize(vSupp) == 2 * nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x1b8,"int Abs_GiaSortNodes(Gia_Man_t *, Vec_Int_t *)");
  }
  memmove(vSupp->pArray,vSupp->pArray + uVar8,uVar8 << 2);
  if ((int)uVar1 <= vSupp->nSize) {
    vSupp->nSize = uVar1;
    return uVar9 - uVar1;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Abs_GiaSortNodes( Gia_Man_t * p, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int nSize = Vec_IntSize(vSupp);
    int i, RetValue;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj) ) // add removable leaves
        {
            assert( pObj->fMark1 );
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        }
    RetValue = Vec_IntSize(vSupp) - nSize;
    Gia_ManForEachObjVec( vSupp, p, pObj, i )
        if ( i < nSize && !(Gia_ObjRefNum(p, pObj) == 0 && !Gia_ObjIsRo(p, pObj)) ) // add non-removable leaves
            Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
    assert( Vec_IntSize(vSupp) == 2 * nSize );
    memmove( Vec_IntArray(vSupp), Vec_IntArray(vSupp) + nSize, sizeof(int) * nSize );
    Vec_IntShrink( vSupp, nSize );
    return RetValue;
}